

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O2

vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *
CRange::init_target(vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__return_storage_ptr__,
                   string *targetfile)

{
  int iVar1;
  ostream *poVar2;
  dictionary *d;
  char *n;
  int n_00;
  undefined1 local_b8 [8];
  Tdata t;
  
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CRange::Tdata,_std::allocator<CRange::Tdata>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (targetfile->_M_string_length != 0) {
    iVar1 = access((targetfile->_M_dataplus)._M_p,4);
    if (iVar1 == 0) {
      d = iniparser_load((targetfile->_M_dataplus)._M_p);
      iVar1 = iniparser_getnsec(d);
      n_00 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      for (; iVar1 != n_00; n_00 = n_00 + 1) {
        n = iniparser_getsecname(d,n_00);
        Tdata::Tdata((Tdata *)local_b8,n,d);
        std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::push_back
                  (__return_storage_ptr__,(Tdata *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
      }
      iniparser_freedict(d);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Could not read target file: ");
      poVar2 = std::operator<<(poVar2,(string *)targetfile);
      poVar2 = std::operator<<(poVar2,". Using default target data.");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  default_target(__return_storage_ptr__);
  std::vector<CRange::Tdata,_std::allocator<CRange::Tdata>_>::operator=
            (__return_storage_ptr__,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CRange::Tdata> CRange::init_target( const std::string &targetfile )
{
    std::vector<CRange::Tdata> target_list;
    if (targetfile.length() > 0) {
        if (access(targetfile.c_str(), R_OK) == 0) {
            dictionary *d = iniparser_load(targetfile.c_str());
            int nsec = iniparser_getnsec(d);
            for (int i = 0; i < nsec; i++) {
                const char *sec = iniparser_getsecname(d, i);
                CRange::Tdata t(sec, d);
                target_list.push_back(t);
            }
            iniparser_freedict(d);
        } else {
            std::cerr << "Could not read target file: " << targetfile
                      << ". Using default target data." << std::endl;
        }
    }
    target_list = CRange::default_target(target_list);
    return target_list;
}